

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float max_ii;
  undefined1 auVar7 [16];
  int *piVar8;
  undefined1 auVar9 [12];
  int iVar10;
  _func_int ***ppp_Var11;
  int iVar12;
  int iVar13;
  float *pfVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int kk;
  ulong uVar19;
  undefined1 auVar20 [16];
  int TILE_K;
  int TILE_M;
  Mat m;
  int TILE_N;
  uint local_160;
  float local_15c;
  uint local_158;
  float local_154;
  float local_150 [2];
  undefined1 local_148 [8];
  undefined4 uStack_140;
  float fStack_13c;
  size_t local_138;
  float local_130 [2];
  undefined8 local_128;
  float local_120;
  int iStack_11c;
  float afStack_118 [4];
  size_t local_108;
  ulong local_100;
  Mat local_f8;
  undefined1 local_a8 [48];
  int iStack_78;
  undefined4 uStack_74;
  int local_70;
  size_t local_68;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  Mat *local_40;
  int local_34;
  
  local_48 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_15c,&local_34,(int *)&local_160,opt->num_threads);
  uVar16 = local_160;
  uVar17 = (outch + (int)local_15c + -1) / (int)local_15c;
  iVar12 = (int)local_15c * local_160;
  local_f8.cstep = 0;
  local_f8.data = (Allocator *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elempack = 0;
  local_f8.elemsize._4_4_ = (int)local_f8.refcount;
  local_f8.allocator = (Allocator *)local_f8.data;
  local_f8.dims = (int)local_f8.refcount;
  local_f8.w = local_f8.refcount._4_4_;
  local_f8.h = (int)local_f8.elemsize;
  local_f8.d = (int)local_f8.refcount;
  local_f8.c = local_f8.elempack;
  local_58 = (ulong)(uint)outch;
  Mat::create(&local_f8,iVar12 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  local_100 = (ulong)(uint)inch;
  local_40 = AT;
  Mat::create(AT,iVar12,0x24,(int)(uVar16 + inch + -1) / (int)uVar16,uVar17,4,(Allocator *)0x0);
  if (0 < (int)uVar17) {
    iVar12 = (int)local_100;
    uVar19 = 0;
    uVar18 = local_100;
    local_158 = uVar17;
    do {
      iVar13 = (int)local_15c * (int)uVar19;
      local_50 = uVar19;
      iVar10 = get_omp_thread_num();
      local_a8._16_8_ = CONCAT44(local_f8.elemsize._4_4_,(int)local_f8.elemsize);
      local_a8._0_8_ =
           (_func_int ***)
           ((long)(_func_int ***)local_f8.data + (long)iVar10 * local_f8.cstep * local_a8._16_8_);
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._24_4_ = local_f8.elempack;
      local_a8._32_8_ = local_f8.allocator;
      auVar9._4_4_ = iStack_78;
      auVar9._8_4_ = uStack_74;
      auVar9._0_4_ = local_f8.w;
      local_a8._40_8_ = auVar9._0_8_ << 0x20;
      iStack_78 = local_f8.h;
      uStack_74 = 1;
      local_70 = local_f8.d;
      local_68 = (local_a8._16_8_ * (long)local_f8.h * (long)local_f8.w + 0xfU & 0xfffffffffffffff0)
                 / (ulong)local_a8._16_8_;
      local_a8._40_4_ = local_f8.dims + -1;
      if (local_f8.dims == 4) {
        local_68 = (long)local_f8.h * (long)local_f8.w;
      }
      if (0 < (int)uVar18) {
        local_154 = (float)((int)local_58 - iVar13);
        iVar10 = 0;
        do {
          local_150[0] = local_15c;
          max_ii = local_154;
          if ((int)local_15c < (int)local_154) {
            max_ii = local_15c;
          }
          uVar16 = (int)uVar18 - iVar10;
          local_150[1] = (float)local_160;
          if ((int)local_160 < (int)uVar16) {
            uVar16 = local_160;
          }
          if (0 < (int)max_ii) {
            pvVar4 = local_48->data;
            uVar18 = 0;
            ppp_Var11 = (_func_int ***)local_a8._0_8_;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  pfVar14 = (float *)((long)pvVar4 +
                                     (uVar19 + (long)iVar10) * 0x24 +
                                     (long)(((int)uVar18 + iVar13) * iVar12 * 9) * 4);
                  lVar15 = 0;
                  do {
                    fVar1 = *pfVar14;
                    fVar2 = pfVar14[1];
                    fVar3 = pfVar14[2];
                    *(float *)(local_148 + lVar15 * 4) = fVar1;
                    fVar5 = fVar2 * 0.47140452;
                    fVar6 = fVar3 * 0.33333334;
                    (&fStack_13c)[lVar15] = fVar1 * -0.6666667 - (fVar5 + fVar6);
                    local_130[lVar15] = (fVar5 + fVar1 * -0.6666667) - fVar6;
                    fVar2 = fVar2 * 0.23570226;
                    *(float *)((long)&local_128 + lVar15 * 4 + 4) =
                         fVar2 + fVar1 * 0.16666667 + fVar6;
                    afStack_118[lVar15] = (fVar1 * 0.16666667 - fVar2) + fVar6;
                    afStack_118[lVar15 + 3] = fVar3;
                    pfVar14 = pfVar14 + 3;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  lVar15 = 8;
                  do {
                    fVar1 = *(float *)((long)local_150 + lVar15);
                    fVar2 = *(float *)((long)local_150 + lVar15 + 4);
                    fVar3 = *(float *)(local_148 + lVar15);
                    fVar5 = fVar2 * 0.47140452;
                    fVar6 = fVar3 * 0.33333334;
                    fVar2 = fVar2 * 0.23570226;
                    *(float *)ppp_Var11 = fVar1;
                    *(float *)((long)ppp_Var11 + 4) = fVar1 * -0.6666667 - (fVar5 + fVar6);
                    *(float *)(ppp_Var11 + 1) = (fVar5 + fVar1 * -0.6666667) - fVar6;
                    *(float *)((long)(ppp_Var11 + 1) + 4) = fVar2 + fVar1 * 0.16666667 + fVar6;
                    *(float *)(ppp_Var11 + 2) = (fVar1 * 0.16666667 - fVar2) + fVar6;
                    *(float *)((long)(ppp_Var11 + 2) + 4) = fVar3;
                    ppp_Var11 = ppp_Var11 + 3;
                    lVar15 = lVar15 + 0xc;
                  } while (lVar15 != 0x50);
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar16);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uint)max_ii);
          }
          iStack_11c = local_40->w;
          local_138 = local_40->elemsize;
          afStack_118[0] = (float)local_40->h;
          local_130[0] = (float)local_40->elempack;
          local_128 = local_40->allocator;
          local_108 = (long)(int)afStack_118[0] * (long)iStack_11c;
          local_148 = (undefined1  [8])
                      ((long)local_40->data +
                      local_138 * local_108 * (long)(iVar10 / (int)local_160) +
                      (long)(iVar13 / (int)local_15c) * local_40->cstep * local_138);
          uStack_140 = 0.0;
          fStack_13c = 0.0;
          local_120 = 2.8026e-45;
          afStack_118[1] = 1.4013e-45;
          afStack_118[2] = 1.4013e-45;
          pack_A_tile((Mat *)local_a8,(Mat *)local_148,0x24,(int)max_ii,uVar16);
          uVar18 = local_100;
          piVar8 = (int *)CONCAT44(fStack_13c,uStack_140);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_128 == (Allocator *)0x0) {
                if (local_148 != (undefined1  [8])0x0) {
                  free((void *)local_148);
                }
              }
              else {
                (*local_128->_vptr_Allocator[3])();
              }
            }
          }
          local_108 = 0;
          auVar7 = ZEXT816(0);
          auVar20 = auVar7 << 0x40;
          local_148 = auVar20._0_8_;
          local_148 = (undefined1  [8])0x0;
          uStack_140 = auVar7._0_4_;
          uStack_140 = 0.0;
          fStack_13c = auVar20._0_4_;
          fStack_13c = 0.0;
          local_138 = auVar20._4_8_;
          local_130[0] = auVar7._4_4_;
          local_130[0] = 0.0;
          iStack_11c = auVar20._4_4_;
          iStack_11c = 0;
          afStack_118[2] = 0.0;
          iVar10 = iVar10 + local_160;
          local_120 = fStack_13c;
          afStack_118[0] = uStack_140;
          afStack_118[1] = local_130[0];
        } while (iVar10 < (int)uVar18);
      }
      uVar16 = local_158;
      piVar8 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
            if ((_func_int ***)local_a8._0_8_ != (_func_int ***)0x0) {
              free((void *)local_a8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_a8._32_8_)[3])();
          }
        }
      }
      local_68 = 0;
      register0x00001200 = ZEXT816(0) << 0x40;
      local_a8._0_8_ = (void *)0x0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._16_8_ = local_a8._44_8_;
      local_a8._24_4_ = 0;
      local_70 = 0;
      uVar17 = (int)local_50 + 1;
      uVar19 = (ulong)uVar17;
    } while (uVar17 != uVar16);
  }
  piVar8 = (int *)CONCAT44(local_f8.refcount._4_4_,(int)local_f8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_f8.data != (Allocator *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 36;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd43_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}